

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTryExpr(BinaryReaderInterp *this,Type sig_type)

{
  FuncDesc *pFVar1;
  Result RVar2;
  Offset OVar3;
  Enum EVar4;
  u32 exn_stack_height;
  Location loc;
  
  RVar2 = TypeChecker::GetCatchCount
                    (&(this->validator_).typechecker_,
                     (int)((ulong)((long)(this->label_stack_).
                                         super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->label_stack_).
                                        super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                     &exn_stack_height);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    loc.field_1._8_8_ = (ulong)(uint)loc.field_1._12_4_ << 0x20;
    loc.filename._M_len = (this->filename_)._M_len;
    loc.filename._M_str = (this->filename_)._M_str;
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    RVar2 = SharedValidator::OnTry(&this->validator_,&loc,sig_type);
    if (RVar2.enum_ != Error) {
      PushLabel(this,Try,0xffffffff,0xffffffff,
                (u32)(((long)(this->func_->handlers).
                             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->func_->handlers).
                            super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38));
      pFVar1 = this->func_;
      loc.filename._M_len = loc.filename._M_len & 0xffffffff00000000;
      OVar3 = Istream::end(this->istream_);
      loc.filename._M_len = CONCAT44(OVar3,(undefined4)loc.filename._M_len);
      loc.filename._M_str = (char *)CONCAT44(loc.filename._M_str._4_4_,0xffffffff);
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      loc.field_1._8_8_ = 0;
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
      emplace_back<wabt::interp::HandlerDesc>(&pFVar1->handlers,(HandlerDesc *)&loc);
      std::_Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
      ~_Vector_base((_Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                     *)&loc.field_1.field_0);
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnTryExpr(Type sig_type) {
  u32 exn_stack_height;
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &exn_stack_height));
  u32 value_stack_height = validator_.type_stack_size();
  CHECK_RESULT(validator_.OnTry(GetLocation(), sig_type));
  // Push a label that tracks mapping of exn -> catch
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(HandlerDesc{HandlerKind::Catch,
                                        istream_.end(),
                                        Istream::kInvalidOffset,
                                        {},
                                        {Istream::kInvalidOffset},
                                        value_stack_height,
                                        exn_stack_height});
  return Result::Ok;
}